

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::~IfcFaceBound(IfcFaceBound *this)

{
  char *pcVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  pcVar1 = (this->Orientation).field_2._M_local_buf + (long)p_Var2;
  *(undefined ***)(pcVar1 + -0x48) = &PTR__IfcFaceBound_00897540;
  *(undefined ***)(pcVar1 + 0x10) = &PTR__IfcFaceBound_008975b8;
  *(undefined ***)(pcVar1 + -0x38) = &PTR__IfcFaceBound_00897568;
  *(undefined ***)(pcVar1 + -0x28) = &PTR__IfcFaceBound_00897590;
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem
                          .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}